

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  uint uVar1;
  Bitmask BVar2;
  ulong uVar3;
  Bitmask BVar4;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    uVar1 = p->flags;
    if (p->op == 0x9e) {
      if ((uVar1 & 8) == 0) {
        uVar3 = sqlite3WhereGetMask(pMaskSet,p->iTable);
        goto LAB_00171307;
      }
      BVar4 = 0;
      uVar3 = 0;
      if ((uVar1 & 0x804000) != 0) goto LAB_00171307;
    }
    else {
      uVar3 = 0;
      if ((uVar1 & 0x804000) != 0) goto LAB_00171307;
      if (p->op == 0xa7) {
        BVar4 = sqlite3WhereGetMask(pMaskSet,p->iTable);
      }
      else {
        BVar4 = 0;
      }
    }
    if (p->pLeft != (Expr *)0x0) {
      BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
      BVar4 = BVar4 | BVar2;
    }
    if (p->pRight == (Expr *)0x0) break;
    uVar5 = uVar5 | BVar4;
    p = p->pRight;
  }
  if ((p->flags >> 0xb & 1) == 0) {
    uVar3 = BVar4;
    if ((p->x).pList == (ExprList *)0x0) goto LAB_00171307;
    uVar3 = sqlite3WhereExprListUsage(pMaskSet,(p->x).pList);
  }
  else {
    if ((p->flags & 0x20) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
  }
  uVar3 = uVar3 | BVar4;
LAB_00171307:
  return uVar3 | uVar5;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
  return mask;
}